

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
::
linear_search_impl<std::__cxx11::string,absl::lts_20250127::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
           *this,string *k,size_type s,ulong e,StringBtreeDefaultLess *comp)

{
  StringBtreeDefaultLess *this_00;
  bool bVar1;
  key_type *this_01;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  string_view sVar2;
  SearchResult<unsigned_long,_true> SVar3;
  OnlyLiteralZero local_74;
  value_type local_73;
  OnlyLiteralZero local_72;
  value_type local_71;
  string_view local_70;
  string_view local_60;
  value_type local_49;
  StringBtreeDefaultLess *pSStack_48;
  weak_ordering c;
  StringBtreeDefaultLess *comp_local;
  size_type e_local;
  size_type s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
  *this_local;
  undefined1 local_10;
  
  pSStack_48 = comp;
  for (e_local = s; this_00 = pSStack_48, e_local < e; e_local = e_local + 1) {
    this_01 = btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
              ::key((btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                     *)this,e_local);
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01)
    ;
    local_60 = sVar2;
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(k);
    local_70 = sVar2;
    local_71 = (value_type)StringBtreeDefaultLess::operator()(this_00,local_60,sVar2);
    local_49 = local_71;
    compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_72,0);
    bVar1 = lts_20250127::operator==(local_71);
    if (bVar1) {
      local_10 = 0;
      s = extraout_RDX;
      goto LAB_00175cc6;
    }
    local_73 = local_49;
    compare_internal::OnlyLiteralZero::OnlyLiteralZero(&local_74,0);
    bVar1 = operator>(local_73);
    s = extraout_RDX_00;
    if (bVar1) break;
  }
  local_10 = 1;
LAB_00175cc6:
  SVar3._9_7_ = (undefined7)(s >> 8);
  SVar3.match = local_10;
  SVar3.value = e_local;
  return SVar3;
}

Assistant:

SearchResult<size_type, true> linear_search_impl(
      const K &k, size_type s, const size_type e, const Compare &comp,
      std::true_type /* IsCompareTo */) const {
    while (s < e) {
      const absl::weak_ordering c = comp(key(s), k);
      if (c == 0) {
        return {s, MatchKind::kEq};
      } else if (c > 0) {
        break;
      }
      ++s;
    }
    return {s, MatchKind::kNe};
  }